

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateCBTests.cpp
# Opt level: O3

void __thiscall
vkt::DynamicState::anon_unknown_4::BlendConstantsTestInstance::initPipeline
          (BlendConstantsTestInstance *this,VkDevice device)

{
  Move<vk::Handle<(vk::HandleType)18>_> *pMVar1;
  DeviceInterface *pDVar2;
  VkPipeline obj;
  StencilOpState _front;
  StencilOpState _back;
  Handle<(vk::HandleType)18> HVar3;
  VkDevice pVVar4;
  VkAllocationCallbacks *pVVar5;
  const_iterator cVar6;
  Move<vk::Handle<(vk::HandleType)18>_> local_478;
  undefined1 local_458 [24];
  VkShaderModule VStack_440;
  VkPipelineColorBlendAttachmentState *local_438;
  VkSpecializationInfo *pVStack_430;
  pointer local_428;
  pointer local_420;
  pointer local_418;
  pointer local_410;
  pointer local_400;
  vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_> local_3e8;
  vector<vk::VkViewport,_std::allocator<vk::VkViewport>_> local_3c8;
  VkShaderModule local_3a8;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_3a0;
  VkShaderModule local_388;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_380;
  VkStencilOpState local_368;
  VkStencilOpState local_348;
  VkPipelineColorBlendAttachmentState VkPipelineColorBlendAttachmentState;
  PipelineCreateInfo pipelineCreateInfo;
  
  pDVar2 = (this->super_DynamicStateBaseClass).m_vk;
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                  *)((this->super_DynamicStateBaseClass).super_TestInstance.m_context)->
                    m_progCollection,&(this->super_DynamicStateBaseClass).m_vertexShaderName);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&pipelineCreateInfo,pDVar2,device,
             *(ProgramBinary **)(cVar6._M_node + 2),0);
  DStack_380.m_device = (VkDevice)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._16_8_;
  DStack_380.m_allocator =
       (VkAllocationCallbacks *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages;
  local_388.m_internal = pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_;
  DStack_380.m_deviceIface =
       (DeviceInterface *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext;
  pDVar2 = (this->super_DynamicStateBaseClass).m_vk;
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                  *)((this->super_DynamicStateBaseClass).super_TestInstance.m_context)->
                    m_progCollection,&(this->super_DynamicStateBaseClass).m_fragmentShaderName);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&pipelineCreateInfo,pDVar2,device,
             *(ProgramBinary **)(cVar6._M_node + 2),0);
  DStack_3a0.m_device = (VkDevice)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._16_8_;
  DStack_3a0.m_allocator =
       (VkAllocationCallbacks *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages;
  local_3a8.m_internal = pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._0_8_;
  DStack_3a0.m_deviceIface =
       (DeviceInterface *)pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext;
  Draw::PipelineCreateInfo::ColorBlendState::Attachment::Attachment
            ((Attachment *)&pipelineCreateInfo,1,VK_BLEND_FACTOR_SRC_ALPHA,
             VK_BLEND_FACTOR_CONSTANT_COLOR,VK_BLEND_OP_ADD,VK_BLEND_FACTOR_SRC_ALPHA,
             VK_BLEND_FACTOR_CONSTANT_ALPHA,VK_BLEND_OP_ADD,0xf);
  VkPipelineColorBlendAttachmentState.srcAlphaBlendFactor =
       pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.flags;
  VkPipelineColorBlendAttachmentState.dstAlphaBlendFactor =
       pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.stageCount;
  VkPipelineColorBlendAttachmentState._24_8_ =
       pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pStages;
  VkPipelineColorBlendAttachmentState.blendEnable =
       pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.sType;
  VkPipelineColorBlendAttachmentState.srcColorBlendFactor =
       pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo._4_4_;
  VkPipelineColorBlendAttachmentState._8_8_ =
       pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo.pNext;
  Draw::PipelineCreateInfo::PipelineCreateInfo
            (&pipelineCreateInfo,
             (VkPipelineLayout)
             (this->super_DynamicStateBaseClass).m_pipelineLayout.
             super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal,
             (VkRenderPass)
             (this->super_DynamicStateBaseClass).m_renderPass.
             super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal,0,0);
  Draw::PipelineCreateInfo::PipelineShaderStage::PipelineShaderStage
            ((PipelineShaderStage *)local_458,local_388,"main",VK_SHADER_STAGE_VERTEX_BIT);
  Draw::PipelineCreateInfo::addShader
            (&pipelineCreateInfo,(VkPipelineShaderStageCreateInfo *)local_458);
  Draw::PipelineCreateInfo::PipelineShaderStage::PipelineShaderStage
            ((PipelineShaderStage *)local_458,local_3a8,"main",VK_SHADER_STAGE_FRAGMENT_BIT);
  Draw::PipelineCreateInfo::addShader
            (&pipelineCreateInfo,(VkPipelineShaderStageCreateInfo *)local_458);
  local_458._0_4_ =
       (this->super_DynamicStateBaseClass).m_vertexInputState.
       super_VkPipelineVertexInputStateCreateInfo.sType;
  local_458._4_4_ =
       *(undefined4 *)
        &(this->super_DynamicStateBaseClass).m_vertexInputState.
         super_VkPipelineVertexInputStateCreateInfo.field_0x4;
  local_458._8_8_ =
       (this->super_DynamicStateBaseClass).m_vertexInputState.
       super_VkPipelineVertexInputStateCreateInfo.pNext;
  local_458._16_4_ =
       (this->super_DynamicStateBaseClass).m_vertexInputState.
       super_VkPipelineVertexInputStateCreateInfo.flags;
  local_458._20_4_ =
       (this->super_DynamicStateBaseClass).m_vertexInputState.
       super_VkPipelineVertexInputStateCreateInfo.vertexBindingDescriptionCount;
  VStack_440.m_internal =
       (deUint64)
       (this->super_DynamicStateBaseClass).m_vertexInputState.
       super_VkPipelineVertexInputStateCreateInfo.pVertexBindingDescriptions;
  local_438 = *(VkPipelineColorBlendAttachmentState **)
               &(this->super_DynamicStateBaseClass).m_vertexInputState.
                super_VkPipelineVertexInputStateCreateInfo.vertexAttributeDescriptionCount;
  pVStack_430 = (VkSpecializationInfo *)
                (this->super_DynamicStateBaseClass).m_vertexInputState.
                super_VkPipelineVertexInputStateCreateInfo.pVertexAttributeDescriptions;
  Draw::PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineVertexInputStateCreateInfo *)local_458);
  Draw::PipelineCreateInfo::InputAssemblerState::InputAssemblerState
            ((InputAssemblerState *)local_458,(this->super_DynamicStateBaseClass).m_topology,0);
  Draw::PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineInputAssemblyStateCreateInfo *)local_458);
  Draw::PipelineCreateInfo::ColorBlendState::ColorBlendState
            ((ColorBlendState *)local_458,1,&VkPipelineColorBlendAttachmentState,0,VK_LOGIC_OP_COPY)
  ;
  Draw::PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineColorBlendStateCreateInfo *)local_458);
  if (local_420 != (pointer)0x0) {
    operator_delete(local_420,(long)local_410 - (long)local_420);
  }
  local_3c8.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3c8.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3c8.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3e8.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3e8.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3e8.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Draw::PipelineCreateInfo::ViewportState::ViewportState
            ((ViewportState *)local_458,1,&local_3c8,&local_3e8);
  Draw::PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineViewportStateCreateInfo *)local_458);
  if (local_410 != (pointer)0x0) {
    operator_delete(local_410,(long)local_400 - (long)local_410);
  }
  if (local_428 != (pointer)0x0) {
    operator_delete(local_428,(long)local_418 - (long)local_428);
  }
  if (local_3e8.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3e8.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3e8.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3e8.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3c8.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3c8.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3c8.
                          super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3c8.
                          super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
            ((StencilOpState *)&local_348,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
             VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
  Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
            ((StencilOpState *)&local_368,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
             VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
  _front.super_VkStencilOpState.depthFailOp = local_348.depthFailOp;
  _front.super_VkStencilOpState.failOp = local_348.failOp;
  _front.super_VkStencilOpState.passOp = local_348.passOp;
  _front.super_VkStencilOpState.compareOp = local_348.compareOp;
  _front.super_VkStencilOpState.compareMask = local_348.compareMask;
  _front.super_VkStencilOpState.writeMask = local_348.writeMask;
  _front.super_VkStencilOpState.reference = local_348.reference;
  _back.super_VkStencilOpState.depthFailOp = local_368.depthFailOp;
  _back.super_VkStencilOpState.failOp = local_368.failOp;
  _back.super_VkStencilOpState.passOp = local_368.passOp;
  _back.super_VkStencilOpState.compareOp = local_368.compareOp;
  _back.super_VkStencilOpState.compareMask = local_368.compareMask;
  _back.super_VkStencilOpState.writeMask = local_368.writeMask;
  _back.super_VkStencilOpState.reference = local_368.reference;
  Draw::PipelineCreateInfo::DepthStencilState::DepthStencilState
            ((DepthStencilState *)local_458,0,0,VK_COMPARE_OP_ALWAYS,0,0,_front,_back,0.0,1.0);
  Draw::PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineDepthStencilStateCreateInfo *)local_458);
  Draw::PipelineCreateInfo::RasterizerState::RasterizerState
            ((RasterizerState *)local_458,0,0,VK_POLYGON_MODE_FILL,0,VK_FRONT_FACE_CLOCKWISE,1,0.0,
             0.0,0.0,1.0);
  Draw::PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineRasterizationStateCreateInfo *)local_458);
  local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
  local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
       (deUint64)operator_new(4);
  local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       (local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal + 4);
  *(undefined4 *)local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
       0xffffffff;
  local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
       (VkDevice)
       local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  Draw::PipelineCreateInfo::MultiSampleState::MultiSampleState
            ((MultiSampleState *)local_458,VK_SAMPLE_COUNT_1_BIT,0,0.0,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_478,false,false);
  Draw::PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineMultisampleStateCreateInfo *)local_458);
  if (local_428 != (pointer)0x0) {
    operator_delete(local_428,(long)local_418 - (long)local_428);
  }
  if ((undefined4 *)
      local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal !=
      (undefined4 *)0x0) {
    operator_delete((void *)local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.
                            m_internal,
                    (long)local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                          m_device -
                    local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.
                    m_internal);
  }
  local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
  local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device = (VkDevice)0x0;
  Draw::PipelineCreateInfo::DynamicState::DynamicState
            ((DynamicState *)local_458,
             (vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_> *)&local_478);
  Draw::PipelineCreateInfo::addState
            (&pipelineCreateInfo,(VkPipelineDynamicStateCreateInfo *)local_458);
  if (local_438 != (VkPipelineColorBlendAttachmentState *)0x0) {
    operator_delete(local_438,(long)local_428 - (long)local_438);
  }
  if ((void *)local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal !=
      (void *)0x0) {
    operator_delete((void *)local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.
                            m_internal,
                    (long)local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                          m_device -
                    local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.
                    m_internal);
  }
  ::vk::createGraphicsPipeline
            (&local_478,(this->super_DynamicStateBaseClass).m_vk,device,(VkPipelineCache)0x0,
             &pipelineCreateInfo.super_VkGraphicsPipelineCreateInfo,(VkAllocationCallbacks *)0x0);
  pVVar5 = local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  pVVar4 = local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  pDVar2 = local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  HVar3.m_internal =
       local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  local_458._16_8_ =
       local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  VStack_440.m_internal =
       (deUint64)local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator
  ;
  local_458._0_8_ =
       local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  local_458._8_8_ =
       local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
  local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  pMVar1 = &(this->super_DynamicStateBaseClass).m_pipeline;
  obj.m_internal =
       (this->super_DynamicStateBaseClass).m_pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>
       .m_data.object.m_internal;
  if (obj.m_internal == 0) {
    (this->super_DynamicStateBaseClass).m_pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.
    m_data.deleter.m_device = pVVar4;
    (this->super_DynamicStateBaseClass).m_pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.
    m_data.deleter.m_allocator = pVVar5;
    (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal =
         HVar3.m_internal;
    (this->super_DynamicStateBaseClass).m_pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.
    m_data.deleter.m_deviceIface = pDVar2;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&(this->super_DynamicStateBaseClass).m_pipeline.
                super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,obj);
    (this->super_DynamicStateBaseClass).m_pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.
    m_data.deleter.m_device = (VkDevice)local_458._16_8_;
    (this->super_DynamicStateBaseClass).m_pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.
    m_data.deleter.m_allocator = (VkAllocationCallbacks *)VStack_440.m_internal;
    (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal =
         local_458._0_8_;
    (this->super_DynamicStateBaseClass).m_pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.
    m_data.deleter.m_deviceIface = (DeviceInterface *)local_458._8_8_;
    if (local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                (&local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
                 (VkPipeline)
                 local_478.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
    }
  }
  if (pipelineCreateInfo.m_multisampleStateSampleMask.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pipelineCreateInfo.m_multisampleStateSampleMask.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)pipelineCreateInfo.m_multisampleStateSampleMask.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)pipelineCreateInfo.m_multisampleStateSampleMask.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (pipelineCreateInfo.m_scissors.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pipelineCreateInfo.m_scissors.
                    super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)pipelineCreateInfo.m_scissors.
                          super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)pipelineCreateInfo.m_scissors.
                          super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (pipelineCreateInfo.m_viewports.
      super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pipelineCreateInfo.m_viewports.
                    super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)pipelineCreateInfo.m_viewports.
                          super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)pipelineCreateInfo.m_viewports.
                          super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (pipelineCreateInfo.m_dynamicStates.
      super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pipelineCreateInfo.m_dynamicStates.
                    super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)pipelineCreateInfo.m_dynamicStates.
                          super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)pipelineCreateInfo.m_dynamicStates.
                          super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (pipelineCreateInfo.m_colorBlendStateAttachments.
      super__Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pipelineCreateInfo.m_colorBlendStateAttachments.
                    super__Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)pipelineCreateInfo.m_colorBlendStateAttachments.
                          super__Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)pipelineCreateInfo.m_colorBlendStateAttachments.
                          super__Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (pipelineCreateInfo.m_shaders.
      super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pipelineCreateInfo.m_shaders.
                    super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)pipelineCreateInfo.m_shaders.
                          super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)pipelineCreateInfo.m_shaders.
                          super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3a8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_3a0,local_3a8);
  }
  if (local_388.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_380,local_388);
  }
  return;
}

Assistant:

virtual void initPipeline (const vk::VkDevice device)
	{
		const vk::Unique<vk::VkShaderModule> vs (createShaderModule(m_vk, device, m_context.getBinaryCollection().get(m_vertexShaderName), 0));
		const vk::Unique<vk::VkShaderModule> fs (createShaderModule(m_vk, device, m_context.getBinaryCollection().get(m_fragmentShaderName), 0));

		const vk::VkPipelineColorBlendAttachmentState VkPipelineColorBlendAttachmentState =
			PipelineCreateInfo::ColorBlendState::Attachment(VK_TRUE,
															vk::VK_BLEND_FACTOR_SRC_ALPHA, vk::VK_BLEND_FACTOR_CONSTANT_COLOR, vk::VK_BLEND_OP_ADD,
															vk::VK_BLEND_FACTOR_SRC_ALPHA, vk::VK_BLEND_FACTOR_CONSTANT_ALPHA, vk::VK_BLEND_OP_ADD);

		PipelineCreateInfo pipelineCreateInfo(*m_pipelineLayout, *m_renderPass, 0, 0);
		pipelineCreateInfo.addShader(PipelineCreateInfo::PipelineShaderStage(*vs, "main", vk::VK_SHADER_STAGE_VERTEX_BIT));
		pipelineCreateInfo.addShader(PipelineCreateInfo::PipelineShaderStage(*fs, "main", vk::VK_SHADER_STAGE_FRAGMENT_BIT));
		pipelineCreateInfo.addState(PipelineCreateInfo::VertexInputState(m_vertexInputState));
		pipelineCreateInfo.addState(PipelineCreateInfo::InputAssemblerState(m_topology));
		pipelineCreateInfo.addState(PipelineCreateInfo::ColorBlendState(1, &VkPipelineColorBlendAttachmentState));
		pipelineCreateInfo.addState(PipelineCreateInfo::ViewportState(1));
		pipelineCreateInfo.addState(PipelineCreateInfo::DepthStencilState());
		pipelineCreateInfo.addState(PipelineCreateInfo::RasterizerState());
		pipelineCreateInfo.addState(PipelineCreateInfo::MultiSampleState());
		pipelineCreateInfo.addState(PipelineCreateInfo::DynamicState());

		m_pipeline = vk::createGraphicsPipeline(m_vk, device, DE_NULL, &pipelineCreateInfo);
	}